

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::IsFiniteFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  LogicalType varargs;
  LogicalType varargs_00;
  LogicalType varargs_01;
  LogicalType varargs_02;
  LogicalType varargs_03;
  ScalarFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  undefined4 in_stack_fffffffffffff7c4;
  undefined4 in_stack_fffffffffffff7cc;
  FunctionNullHandling in_stack_fffffffffffff7d8;
  bind_lambda_function_t in_stack_fffffffffffff7e0;
  LogicalType local_818;
  scalar_function_t local_800;
  scalar_function_t local_7e0;
  scalar_function_t local_7c0;
  scalar_function_t local_7a0;
  scalar_function_t local_780;
  LogicalType local_760;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_748;
  LogicalType local_730;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_718;
  LogicalType local_700;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_6e8;
  LogicalType local_6d0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_6b8;
  LogicalType local_6a0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_688;
  LogicalType local_670;
  LogicalType local_658;
  LogicalType local_640;
  LogicalType local_628;
  LogicalType local_610;
  ScalarFunction local_5f8;
  ScalarFunction local_4d0;
  ScalarFunction local_3a8;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::LogicalType(&local_818,FLOAT);
  __l._M_len = 1;
  __l._M_array = &local_818;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_688,__l,(allocator_type *)&stack0xfffffffffffff7e7);
  LogicalType::LogicalType(&local_6a0,BOOLEAN);
  local_780.super__Function_base._M_functor._8_8_ = 0;
  local_780.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<float,bool,duckdb::IsFiniteOperator>;
  local_780._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_780.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_610,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_610;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffff7c4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffff7cc;
  ScalarFunction::ScalarFunction
            (&local_158,(vector<duckdb::LogicalType,_true> *)&local_688,&local_6a0,&local_780,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_fffffffffffff7d8,in_stack_fffffffffffff7e0);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_158);
  ScalarFunction::~ScalarFunction(&local_158);
  LogicalType::~LogicalType(&local_610);
  ::std::_Function_base::~_Function_base(&local_780.super__Function_base);
  LogicalType::~LogicalType(&local_6a0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_688);
  LogicalType::~LogicalType(&local_818);
  LogicalType::LogicalType(&local_818,DOUBLE);
  __l_00._M_len = 1;
  __l_00._M_array = &local_818;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_6b8,__l_00,(allocator_type *)&stack0xfffffffffffff7e7);
  LogicalType::LogicalType(&local_6d0,BOOLEAN);
  local_7a0.super__Function_base._M_functor._8_8_ = 0;
  local_7a0.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<double,bool,duckdb::IsFiniteOperator>;
  local_7a0._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_7a0.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_628,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_628;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff7c4;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff7cc;
  ScalarFunction::ScalarFunction
            (&local_280,(vector<duckdb::LogicalType,_true> *)&local_6b8,&local_6d0,&local_7a0,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
             in_stack_fffffffffffff7d8,in_stack_fffffffffffff7e0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_280);
  ScalarFunction::~ScalarFunction(&local_280);
  LogicalType::~LogicalType(&local_628);
  ::std::_Function_base::~_Function_base(&local_7a0.super__Function_base);
  LogicalType::~LogicalType(&local_6d0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_6b8);
  LogicalType::~LogicalType(&local_818);
  LogicalType::LogicalType(&local_818,DATE);
  __l_01._M_len = 1;
  __l_01._M_array = &local_818;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_6e8,__l_01,(allocator_type *)&stack0xfffffffffffff7e7);
  LogicalType::LogicalType(&local_700,BOOLEAN);
  local_7c0.super__Function_base._M_functor._8_8_ = 0;
  local_7c0.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<duckdb::date_t,bool,duckdb::IsFiniteOperator>;
  local_7c0._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_7c0.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_640,INVALID);
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_01._0_8_ = &local_640;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff7c4;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff7cc;
  ScalarFunction::ScalarFunction
            (&local_3a8,(vector<duckdb::LogicalType,_true> *)&local_6e8,&local_700,&local_7c0,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_01,CONSISTENT,
             in_stack_fffffffffffff7d8,in_stack_fffffffffffff7e0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_3a8);
  ScalarFunction::~ScalarFunction(&local_3a8);
  LogicalType::~LogicalType(&local_640);
  ::std::_Function_base::~_Function_base(&local_7c0.super__Function_base);
  LogicalType::~LogicalType(&local_700);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_6e8);
  LogicalType::~LogicalType(&local_818);
  LogicalType::LogicalType(&local_818,TIMESTAMP);
  __l_02._M_len = 1;
  __l_02._M_array = &local_818;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_718,__l_02,(allocator_type *)&stack0xfffffffffffff7e7);
  LogicalType::LogicalType(&local_730,BOOLEAN);
  local_7e0.super__Function_base._M_functor._8_8_ = 0;
  local_7e0.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<duckdb::timestamp_t,bool,duckdb::IsFiniteOperator>;
  local_7e0._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_7e0.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_658,INVALID);
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_02._0_8_ = &local_658;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff7c4;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff7cc;
  ScalarFunction::ScalarFunction
            (&local_4d0,(vector<duckdb::LogicalType,_true> *)&local_718,&local_730,&local_7e0,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_02,CONSISTENT,
             in_stack_fffffffffffff7d8,in_stack_fffffffffffff7e0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_4d0);
  ScalarFunction::~ScalarFunction(&local_4d0);
  LogicalType::~LogicalType(&local_658);
  ::std::_Function_base::~_Function_base(&local_7e0.super__Function_base);
  LogicalType::~LogicalType(&local_730);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_718);
  LogicalType::~LogicalType(&local_818);
  LogicalType::LogicalType(&local_818,TIMESTAMP_TZ);
  __l_03._M_len = 1;
  __l_03._M_array = &local_818;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_748,__l_03,(allocator_type *)&stack0xfffffffffffff7e7);
  LogicalType::LogicalType(&local_760,BOOLEAN);
  local_800.super__Function_base._M_functor._8_8_ = 0;
  local_800.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<duckdb::timestamp_t,bool,duckdb::IsFiniteOperator>;
  local_800._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_800.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_670,INVALID);
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_03._0_8_ = &local_670;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff7c4;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff7cc;
  ScalarFunction::ScalarFunction
            (&local_5f8,(vector<duckdb::LogicalType,_true> *)&local_748,&local_760,&local_800,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_03,CONSISTENT,
             in_stack_fffffffffffff7d8,in_stack_fffffffffffff7e0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_5f8);
  ScalarFunction::~ScalarFunction(&local_5f8);
  LogicalType::~LogicalType(&local_670);
  ::std::_Function_base::~_Function_base(&local_800.super__Function_base);
  LogicalType::~LogicalType(&local_760);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_748);
  LogicalType::~LogicalType(&local_818);
  return in_RDI;
}

Assistant:

ScalarFunctionSet IsFiniteFun::GetFunctions() {
	ScalarFunctionSet funcs;
	funcs.AddFunction(ScalarFunction({LogicalType::FLOAT}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<float, bool, IsFiniteOperator>));
	funcs.AddFunction(ScalarFunction({LogicalType::DOUBLE}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<double, bool, IsFiniteOperator>));
	funcs.AddFunction(ScalarFunction({LogicalType::DATE}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<date_t, bool, IsFiniteOperator>));
	funcs.AddFunction(ScalarFunction({LogicalType::TIMESTAMP}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<timestamp_t, bool, IsFiniteOperator>));
	funcs.AddFunction(ScalarFunction({LogicalType::TIMESTAMP_TZ}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<timestamp_t, bool, IsFiniteOperator>));
	return funcs;
}